

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  int iVar1;
  int _w;
  int _c;
  Mat m;
  Mat cutm;
  
  if (right + left == 0 && bottom + top == 0) {
    Mat::operator=(dst,src);
    return;
  }
  _w = src->w - (right + left);
  iVar1 = src->h - (bottom + top);
  if (src->dims == 3) {
    _c = src->c;
    Mat::create(dst,_w,iVar1,_c,4);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      iVar1 = 0;
      if (_c < 1) {
        _c = 0;
      }
      for (; _c != iVar1; iVar1 = iVar1 + 1) {
        Mat::channel(&m,src,iVar1);
        Mat::channel(&cutm,dst,iVar1);
        copy_cut_border_image(&m,&cutm,top,left);
        Mat::~Mat(&cutm);
        Mat::~Mat(&m);
      }
    }
  }
  else if (src->dims == 2) {
    Mat::create(dst,_w,iVar1,4);
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      copy_cut_border_image(src,dst,top,left);
      return;
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}